

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void __thiscall
mpark::detail::
assignment<mpark::detail::traits<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>
::assign_alt<0ul,int,int_const&>
          (assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,alt<0UL,_int> *a,int *arg)

{
  char *pcVar1;
  int *piVar2;
  int in_EDX;
  undefined4 in_register_00000014;
  int *in_RSI;
  base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  anon_struct_16_2_0431621f impl;
  anon_struct_16_2_0431621f local_28;
  remove_reference_t<const_int_&> *local_18;
  int *local_10;
  
  local_18 = (remove_reference_t<const_int_&> *)CONCAT44(in_register_00000014,in_EDX);
  local_10 = in_RSI;
  pcVar1 = base<(mpark::detail::Trait)1,_int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::index(in_RDI,(char *)in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    piVar2 = lib::cpp14::forward<int_const&>(local_18);
    *local_10 = *piVar2;
  }
  else {
    local_28.arg_ = lib::cpp14::forward<int_const&>(local_18);
    assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::assign_alt<0UL,_int,_const_int_&>::anon_struct_16_2_0431621f::operator()(&local_28);
  }
  return;
}

Assistant:

inline void assign_alt(alt<I, T> &a, Arg &&arg) {
        if (this->index() == I) {
#ifdef _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4244)
#endif
          a.value = lib::forward<Arg>(arg);
#ifdef _MSC_VER
#pragma warning(pop)
#endif
        } else {
          struct {
            void operator()(std::true_type) const {
              this_->emplace<I>(lib::forward<Arg>(arg_));
            }
            void operator()(std::false_type) const {
              this_->emplace<I>(T(lib::forward<Arg>(arg_)));
            }
            assignment *this_;
            Arg &&arg_;
          } impl{this, lib::forward<Arg>(arg)};
          impl(lib::bool_constant<
                   std::is_nothrow_constructible<T, Arg>::value ||
                   !std::is_nothrow_move_constructible<T>::value>{});
        }
      }